

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs_impl::any_const&)>
::_call<0,1,2>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               *__return_storage_ptr__,void *this,vector *args,sequence<0,_1,_2> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  numeric *pnVar2;
  _Alloc_hider local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  pbVar1 = try_convert_and_check<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  pnVar2 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
  if (*(long *)((long)this + 0x10) != 0) {
    (**(code **)((long)this + 0x18))
              (&local_40,this,pbVar1,pnVar2,
               (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start + 2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((size_type *)local_40._M_p == &local_30) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_28;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
    }
    __return_storage_ptr__->_M_string_length = local_38;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}